

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)400>(Result *__return_storage_ptr__,Model *format)

{
  int iVar1;
  bool bVar2;
  Type *pTVar3;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  int i;
  int iVar4;
  undefined1 *puVar5;
  long lStackY_190;
  ValidationPolicy *in_stack_fffffffffffffe78;
  string local_180;
  RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> weights;
  GLMClassifier glmClassifier;
  Result result;
  ModelDescription interface;
  
  puVar5 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar5 == (ModelDescription *)0x0) {
    puVar5 = Specification::_ModelDescription_default_instance_;
  }
  Specification::ModelDescription::ModelDescription(&interface,(ModelDescription *)puVar5);
  if (format->_oneof_case_[0] == 400) {
    puVar5 = (undefined1 *)(format->Type_).pipelineclassifier_;
  }
  else {
    puVar5 = Specification::_GLMClassifier_default_instance_;
  }
  glmClassifier.super_MessageLite._vptr_MessageLite._0_4_ = 0;
  validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::GLMClassifier>
            (&result,(CoreML *)format,(Model *)puVar5,(GLMClassifier *)0x0,false,
             SUB81(&glmClassifier,0),in_stack_fffffffffffffe78);
  bVar2 = Result::good(&result);
  if (bVar2) {
    validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)&glmClassifier,(CoreML *)&interface.input_,features);
    Result::operator=(&result,(Result *)&glmClassifier);
    std::__cxx11::string::~string((string *)&glmClassifier.super_MessageLite._internal_metadata_);
    bVar2 = Result::good(&result);
    if (bVar2) {
      if (format->_oneof_case_[0] == 400) {
        puVar5 = (undefined1 *)(format->Type_).glmclassifier_;
      }
      else {
        puVar5 = Specification::_GLMClassifier_default_instance_;
      }
      Specification::GLMClassifier::GLMClassifier(&glmClassifier,(GLMClassifier *)puVar5);
      if ((uint)glmClassifier.postevaluationtransform_ < 2) {
        if (1 < (uint)glmClassifier.classencoding_) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,"Invalid class encoding",(allocator<char> *)&weights);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
          goto LAB_0026dff2;
        }
        if (glmClassifier.weights_.super_RepeatedPtrFieldBase.current_size_ == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,
                     "The number of DoubleArrays in weights must be greater than zero",
                     (allocator<char> *)&weights);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
          goto LAB_0026dff2;
        }
        if (glmClassifier.weights_.super_RepeatedPtrFieldBase.current_size_ !=
            glmClassifier.offset_.current_size_) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,
                     "The number of DoubleArrays in weights must match number of offsets",
                     (allocator<char> *)&weights);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
          goto LAB_0026dff2;
        }
        if (glmClassifier._oneof_case_[0] == 0x65) {
          lStackY_190 = 0x10;
LAB_0026e033:
          iVar4 = *(int *)((long)&((glmClassifier.ClassLabels_.stringclasslabels_)->
                                  super_MessageLite)._vptr_MessageLite + lStackY_190);
        }
        else {
          if (glmClassifier._oneof_case_[0] == 100) {
            lStackY_190 = 0x18;
            goto LAB_0026e033;
          }
          iVar4 = -1;
        }
        if (glmClassifier.classencoding_ == 0) {
          if (glmClassifier.weights_.super_RepeatedPtrFieldBase.current_size_ == iVar4 + -1 ||
              iVar4 == -1) {
LAB_0026e0cf:
            if ((glmClassifier.postevaluationtransform_ != 1) || (iVar4 < 3)) goto LAB_0026e104;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,
                       "Probit post evaluation transform is only supported for binary classification"
                       ,(allocator<char> *)&weights);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,
                       "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes"
                       ,(allocator<char> *)&weights);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
          }
          goto LAB_0026dff2;
        }
        if (iVar4 != -1) {
          if (iVar4 == 2) {
            if (glmClassifier.weights_.super_RepeatedPtrFieldBase.current_size_ == 1)
            goto LAB_0026e104;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,
                       "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one"
                       ,(allocator<char> *)&weights);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
          }
          else {
            if (glmClassifier.weights_.super_RepeatedPtrFieldBase.current_size_ == iVar4)
            goto LAB_0026e0cf;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,
                       "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes"
                       ,(allocator<char> *)&weights);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
          }
          goto LAB_0026dff2;
        }
LAB_0026e104:
        google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
        RepeatedPtrField(&weights,&glmClassifier.weights_);
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                           (&weights.super_RepeatedPtrFieldBase,0);
        if ((pTVar3->value_).current_size_ == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,"Weight DoubleArrays must have nonzero length",
                     (allocator<char> *)&stack0xfffffffffffffe7f);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
        }
        else {
          iVar4 = 1;
          do {
            if (weights.super_RepeatedPtrFieldBase.current_size_ <= iVar4) {
              Result::Result(__return_storage_ptr__);
              goto LAB_0026e1b5;
            }
            pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                               (&weights.super_RepeatedPtrFieldBase,0);
            iVar1 = (pTVar3->value_).current_size_;
            pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                               (&weights.super_RepeatedPtrFieldBase,iVar4);
            iVar4 = iVar4 + 1;
          } while (iVar1 == (pTVar3->value_).current_size_);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,"Weight DoubleArrays must have the same length",
                     (allocator<char> *)&stack0xfffffffffffffe7f);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
        }
        std::__cxx11::string::~string((string *)&local_180);
LAB_0026e1b5:
        google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
        ~RepeatedPtrField(&weights);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"Invalid post evaluation transform",
                   (allocator<char> *)&weights);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
LAB_0026dff2:
        std::__cxx11::string::~string((string *)&local_180);
      }
      Specification::GLMClassifier::~GLMClassifier(&glmClassifier);
      goto LAB_0026e006;
    }
  }
  Result::Result(__return_storage_ptr__,&result);
LAB_0026e006:
  std::__cxx11::string::~string((string *)&result.m_message);
  Specification::ModelDescription::~ModelDescription(&interface);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmClassifier>(const Specification::Model& format) {

        // Check has a classifier interface
        Specification::ModelDescription interface = format.description();
        Result result = validateClassifierInterface(format, format.glmclassifier());
        if (!result.good()) {
            return result;
        }
        
        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(interface.input());
        if (!result.good()) {
            return result;
        }

        Specification::GLMClassifier glmClassifier = format.glmclassifier();

        // Check PostEvluationTransfrom and ClassEncoding have allowed values
        if(glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Logit
           && glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid post evaluation transform");
        }
        if(glmClassifier.classencoding() != Specification::GLMClassifier::ReferenceClass
           && glmClassifier.classencoding() != Specification::GLMClassifier::OneVsRest) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid class encoding");
        }

        // Check has weights and same size as offsets
        int numCoefficient = glmClassifier.weights_size();
        if(numCoefficient == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must be greater than zero");
        }
        if(numCoefficient != glmClassifier.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must match number of offsets");
        }

        // Check number of weight vector makes sense based on the number of classes and the class encoding
        int numClasses;
        switch (glmClassifier.ClassLabels_case()) {
            case Specification::GLMClassifier::kInt64ClassLabels:
                numClasses = glmClassifier.int64classlabels().vector_size();
                break;
            case Specification::GLMClassifier::kStringClassLabels:
                numClasses = glmClassifier.stringclasslabels().vector_size();
                break;
            case Specification::GLMClassifier::CLASSLABELS_NOT_SET:
                numClasses = -1;
                break;
        }
        if(glmClassifier.classencoding() == Specification::GLMClassifier::ReferenceClass) {
            if (numClasses != -1 && numCoefficient != numClasses - 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes");
            }
        } else { // One vs Rest encoding
            if(numClasses == 2) {
                if(numCoefficient != 1) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one");
                }
            } else if (numClasses != -1 && numCoefficient != numClasses) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes");
            }
        }

        // Probit is only supported for binary classification
        if(numClasses > 2 && glmClassifier.postevaluationtransform() == Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Probit post evaluation transform is only supported for binary classification");
        }

        // Check all DoubleArrays in weights have the same, nonzero length
        auto weights = glmClassifier.weights();
        if(weights[0].value_size() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have nonzero length");
        }
        for(int i = 1; i < weights.size(); i++) {
            if(weights[0].value_size() != weights[i].value_size()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have the same length");
            }
        }

        return Result();
    }